

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O0

void __thiscall
jetbrains::teamcity::TeamcityMessages::testFinished
          (TeamcityMessages *this,string *name,unsigned_long durationMs,string *flowId)

{
  string local_228;
  stringstream local_208 [8];
  stringstream out;
  undefined1 local_1f8 [376];
  string local_80;
  string local_50;
  RaiiMessage local_30;
  RaiiMessage msg;
  string *flowId_local;
  unsigned_long durationMs_local;
  string *name_local;
  TeamcityMessages *this_local;
  
  msg.m_out = (ostream *)flowId;
  anon_unknown_1::RaiiMessage::RaiiMessage(&local_30,"testFinished",this->m_out);
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  anon_unknown_1::RaiiMessage::writeProperty(&local_30,"name",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_80,(string *)msg.m_out);
  anon_unknown_1::RaiiMessage::writePropertyIfNonEmpty(&local_30,"flowId",&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::stringstream::stringstream(local_208,_S_out);
  std::ostream::operator<<(local_1f8,durationMs);
  std::__cxx11::stringstream::str();
  anon_unknown_1::RaiiMessage::writeProperty(&local_30,"duration",&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::stringstream::~stringstream(local_208);
  anon_unknown_1::RaiiMessage::~RaiiMessage(&local_30);
  return;
}

Assistant:

void TeamcityMessages::testFinished(const std::string& name, const unsigned long durationMs, const std::string& flowId)
{
    RaiiMessage msg("testFinished", *m_out);

    msg.writeProperty("name", name);
    msg.writePropertyIfNonEmpty("flowId", flowId);

    /// \bug W/ some locales it is possible to get a number w/ a number separator(s)!
    /// \todo Make a test for that!
    std::stringstream out(std::ios_base::out);
    out << durationMs;
    msg.writeProperty("duration", out.str());
}